

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::reporters::Config_testLoadConfig_Test::~Config_testLoadConfig_Test
          (Config_testLoadConfig_Test *this)

{
  Config_testLoadConfig_Test *this_local;
  
  ~Config_testLoadConfig_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Config, testLoadConfig)
{
    std::string yamlConfig =
        "disabled: false\n"
        "reporter:\n"
        "    logSpans: true\n"
        "    bufferFlushInterval: 88\n"
        "    localAgentHostPort: ahost:22\n"
        "    endpoint: http://somehost:33/api/traces\n"
        "sampler:\n"
        "  type: const\n"
        "  param: 1";

    auto configYAML = YAML::Load(yamlConfig);
    auto reporterYAML = configYAML["reporter"];
    auto config = jaegertracing::reporters::Config::parse(reporterYAML);

    ASSERT_EQ(true, config.logSpans());
    ASSERT_EQ(std::chrono::seconds(88), config.bufferFlushInterval());
    ASSERT_EQ(std::string("ahost:22"), config.localAgentHostPort());
    ASSERT_EQ(std::string("http://somehost:33/api/traces"), config.endpoint());
}